

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolUDP.cpp
# Opt level: O0

DataBuffer * __thiscall ProtocolUDP::GetTxBuffer(ProtocolUDP *this,InterfaceMAC *mac)

{
  DataBuffer *pDVar1;
  size_t sVar2;
  DataBuffer *buffer;
  InterfaceMAC *mac_local;
  ProtocolUDP *this_local;
  
  pDVar1 = ProtocolIPv4::GetTxBuffer(this->IP,mac);
  if (pDVar1 != (DataBuffer *)0x0) {
    sVar2 = header_size();
    pDVar1->Packet = pDVar1->Packet + sVar2;
    sVar2 = header_size();
    pDVar1->Remainder = pDVar1->Remainder - (short)sVar2;
  }
  return pDVar1;
}

Assistant:

DataBuffer* ProtocolUDP::GetTxBuffer(InterfaceMAC* mac)
{
    DataBuffer* buffer;

    buffer = IP.GetTxBuffer(mac);
    if (buffer != nullptr)
    {
        buffer->Packet += header_size();
        buffer->Remainder -= header_size();
    }

    return buffer;
}